

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftpd.c
# Opt level: O1

void nak(int error)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  int *piVar4;
  size_t __n;
  
  buf.hdr.th_opcode = 0x500;
  buf._2_2_ = (ushort)error << 8 | (ushort)error >> 8;
  piVar4 = &formata[2].f_convert;
  do {
    iVar1 = piVar4[2];
    piVar4 = piVar4 + 4;
    if (iVar1 < 0) break;
  } while (iVar1 != error);
  if (iVar1 < 0) {
    pcVar2 = strerror(error + -100);
    *(char **)piVar4 = pcVar2;
    buf._2_2_ = 0;
  }
  pcVar2 = *(char **)piVar4;
  sVar3 = strlen(pcVar2);
  memcpy((void *)((long)&buf.hdr.th_u1 + 2),pcVar2,(long)((sVar3 << 0x20) + 0x100000000) >> 0x20);
  __n = (long)((sVar3 << 0x20) + 0x500000000) >> 0x20;
  sVar3 = send(peer,&buf,__n,0x4000);
  if (sVar3 == __n) {
    return;
  }
  logmsg("nak: fail\n");
  return;
}

Assistant:

static void nak(int error)
{
  struct tftphdr *tp;
  int length;
  struct errmsg *pe;

  tp = &buf.hdr;
  tp->th_opcode = htons((unsigned short)opcode_ERROR);
  tp->th_code = htons((unsigned short)error);
  for (pe = errmsgs; pe->e_code >= 0; pe++)
    if (pe->e_code == error)
      break;
  if (pe->e_code < 0) {
    pe->e_msg = strerror(error - 100);
    tp->th_code = EUNDEF;   /* set 'undef' errorcode */
  }
  length = (int)strlen(pe->e_msg);

  /* we use memcpy() instead of strcpy() in order to avoid buffer overflow
   * report from glibc with FORTIFY_SOURCE */
  memcpy(tp->th_msg, pe->e_msg, length + 1);
  length += 5;
  if (swrite(peer, &buf.storage[0], length) != length)
    logmsg("nak: fail\n");
}